

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::DynamicMapField::DeleteMapValue(DynamicMapField *this,MapKey *map_key)

{
  iterator pos;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
  local_48;
  
  MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
            (&local_48,(this->map_).elements_,map_key,(TreeIterator *)0x0);
  if (local_48.first.node_ != (Node *)0x0) {
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.state_ = 0;
    MapValueRef::DeleteData(&(((local_48.first.node_)->kv).v_)->second);
    pos.it_.m_ = local_48.first.m_;
    pos.it_.node_ = local_48.first.node_;
    pos.it_.bucket_index_ = local_48.first.bucket_index_;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
              ((iterator *)&local_48,&this->map_,pos);
  }
  return local_48.first.node_ != (Node *)0x0;
}

Assistant:

bool DynamicMapField::DeleteMapValue(const MapKey& map_key) {
  MapFieldBase::SyncMapWithRepeatedField();
  Map<MapKey, MapValueRef>::iterator iter = map_.find(map_key);
  if (iter == map_.end()) {
    return false;
  }
  // Set map dirty only if the delete is successful.
  MapFieldBase::SetMapDirty();
  iter->second.DeleteData();
  map_.erase(iter);
  return true;
}